

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsBool helicsFederateIsAsyncOperationCompleted(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  bool bVar1;
  FedObject *pFVar2;
  uint uVar3;
  
  pFVar2 = helics::getFedObject(fed,err);
  uVar3 = 0;
  if ((pFVar2 != (FedObject *)0x0) &&
     (this = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, uVar3 = 0, this != (Federate *)0x0)) {
    bVar1 = helics::Federate::isAsyncOperationCompleted(this);
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

HelicsBool helicsFederateIsAsyncOperationCompleted(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_FALSE;
    }
    try {
        return (fedObj->isAsyncOperationCompleted()) ? HELICS_TRUE : HELICS_FALSE;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
}